

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# unqlite.c
# Opt level: O1

sxi32 jx9CompileScript(jx9_vm *pVm,SyString *pScript,sxi32 iFlags)

{
  sxu32 in_EAX;
  SySet aToken;
  SySet local_38;
  
  if (pScript->nByte != 0) {
    local_38.nSize = 0;
    local_38.eSize = 0x20;
    local_38.nUsed = 0;
    local_38.nCursor = 0;
    local_38.pBase = (void *)0x0;
    local_38.pUserData = (void *)0x0;
    local_38.pAllocator = &pVm->sAllocator;
    local_38.pBase = SyMemBackendAlloc(&pVm->sAllocator,0x1800);
    if ((SyToken *)local_38.pBase != (SyToken *)0x0) {
      local_38.nSize = 0xc0;
    }
    jx9Tokenize(pScript->zString,pScript->nByte,&local_38);
    in_EAX = local_38.nUsed;
    if ((ulong)local_38.nUsed != 0) {
      (pVm->sCodeGen).pIn = (SyToken *)local_38.pBase;
      (pVm->sCodeGen).pEnd = (SyToken *)((long)local_38.pBase + (ulong)local_38.nUsed * 0x20);
      in_EAX = GenStateCompileChunk(&pVm->sCodeGen,0);
      if (((jx9_vm *)local_38.pAllocator != (jx9_vm *)0x0) &&
         ((SyToken *)local_38.pBase != (SyToken *)0x0)) {
        in_EAX = SyMemBackendFree(local_38.pAllocator,local_38.pBase);
      }
    }
  }
  return in_EAX;
}

Assistant:

JX9_PRIVATE sxi32 jx9CompileScript(
	jx9_vm *pVm,        /* Generate JX9 bytecodes for this Virtual Machine */
	SyString *pScript,  /* Script to compile */
	sxi32 iFlags        /* Compile flags */
	)
{
	jx9_gen_state *pGen;
	SySet aToken;
	sxi32 rc;
	if( pScript->nByte < 1 ){
		/* Nothing to compile */
		return JX9_OK;
	}
	/* Initialize the tokens containers */
	SySetInit(&aToken, &pVm->sAllocator, sizeof(SyToken));
	SySetAlloc(&aToken, 0xc0);
	pGen = &pVm->sCodeGen;
	rc = JX9_OK;
	/* Tokenize the JX9 chunk first */
	jx9Tokenize(pScript->zString,pScript->nByte,&aToken);
	if( SySetUsed(&aToken) < 1 ){
		return SXERR_EMPTY;
	}
	/* Point to the head and tail of the token stream. */
	pGen->pIn  = (SyToken *)SySetBasePtr(&aToken);
	pGen->pEnd = &pGen->pIn[SySetUsed(&aToken)];
	/* Compile the chunk */
	rc = GenStateCompileChunk(pGen,iFlags);
	/* Cleanup */
	SySetRelease(&aToken);
	return rc;
}